

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O0

void __thiscall jrtplib::RTCPSDESInfo::Clear(RTCPSDESInfo *this)

{
  SDESPrivateItem *obj;
  bool bVar1;
  reference ppSVar2;
  RTPMemoryManager *mgr;
  iterator local_38;
  _List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*> local_30;
  iterator local_28;
  _List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*> local_20;
  _List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*> local_18;
  const_iterator it;
  RTCPSDESInfo *this_local;
  
  it._M_node = (_List_node_base *)this;
  std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
            (&local_18);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
       ::begin(&this->privitems);
  std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
            (&local_20,&local_28);
  local_18._M_node = local_20._M_node;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
         ::end(&this->privitems);
    std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
              (&local_30,&local_38);
    bVar1 = std::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&local_18);
    obj = *ppSVar2;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTCPSDESInfo::SDESPrivateItem>(obj,mgr);
    std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++(&local_18);
  }
  std::__cxx11::
  list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
  ::clear(&this->privitems);
  return;
}

Assistant:

void RTCPSDESInfo::Clear()
{
#ifdef RTP_SUPPORT_SDESPRIV
	std::list<SDESPrivateItem *>::const_iterator it;

	for (it = privitems.begin() ; it != privitems.end() ; ++it)
		RTPDelete(*it,GetMemoryManager());
	privitems.clear();
#endif // RTP_SUPPORT_SDESPRIV
}